

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

int GetCharConstInApostrophes(char **op,aint *val)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  
  pbVar2 = (byte *)*op;
  bVar1 = *pbVar2;
  uVar3 = (uint)bVar1;
  if (bVar1 != 0) {
    if (bVar1 == 0x27) {
      if (pbVar2[1] != 0x27) {
        return 0;
      }
      *val = 0x27;
      *op = (char *)(pbVar2 + 2);
    }
    else {
      *op = (char *)(pbVar2 + 1);
      *val = (int)(char)*pbVar2;
    }
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

int GetCharConstInApostrophes(char*& op, aint& val) {
	if ('\'' == op[0] && '\'' == op[1]) {	// '' converts to actual apostrophe as value
		val = '\'';
		op += 2;
		return 1;
	}
	if ('\'' == *op || !*op) return 0;		// closing apostrophe or no more characters, return 0
	// normal character, just return it
	val = *op++;
	return 1;
}